

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O0

void do_abort_change_class_name_proc(Am_Object *inter)

{
  Am_Object_Method_Type *pAVar1;
  byte bVar2;
  Am_Value *value;
  Am_Value *pAVar3;
  Am_Object local_58;
  Am_Object local_50;
  Am_String local_48;
  Am_String new_name;
  Am_Object_Method local_28;
  Am_Object local_18;
  Am_Object proto;
  Am_Object *inter_local;
  
  proto.data = (Am_Object_Data *)inter;
  Am_Object::Get_Prototype();
  value = (Am_Value *)Am_Object::Get((ushort)&local_18,0xc9);
  Am_Object_Method::Am_Object_Method(&local_28,value);
  Am_Object::Am_Object((Am_Object *)&new_name,(Am_Object *)inter);
  (*local_28.Call)((Am_Object_Data *)&new_name);
  Am_Object::~Am_Object((Am_Object *)&new_name);
  pAVar3 = (Am_Value *)Am_Object::Get((ushort)inter,0x16c);
  Am_String::Am_String(&local_48,pAVar3);
  bVar2 = Am_String::operator==(&local_48,"");
  if ((bVar2 & 1) != 0) {
    Am_Object::Am_Object(&local_50,(Am_Object *)&Am_No_Object);
    Am_Beep((Am_Object *)&local_50);
    Am_Object::~Am_Object(&local_50);
    pAVar1 = do_delete_class.Call;
    Am_Object::Am_Object(&local_58,(Am_Object *)inter);
    (*pAVar1)((Am_Object_Data *)&local_58);
    Am_Object::~Am_Object(&local_58);
  }
  Am_String::~Am_String(&local_48);
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_abort_change_class_name,
                 (Am_Object inter))
{
  // call prototype's method
  Am_Object proto = inter.Get_Prototype();
  Am_Object_Method(proto.Get(Am_ABORT_DO_METHOD)).Call(inter);

  Am_String new_name = inter.Get(Am_OLD_VALUE);
  if (new_name == NEW_CLASS_NAME) {
    // user was entering name for a new class, but aborted.
    // Delete the new class
    extern Am_Object_Method do_delete_class;
    Am_Beep();
    do_delete_class.Call(inter);
  }
}